

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O2

bool __thiscall QStringView::startsWith(QStringView *this,QStringView s,CaseSensitivity cs)

{
  undefined1 uVar1;
  
  uVar1 = QtPrivate::startsWith(*this,s,cs);
  return (bool)uVar1;
}

Assistant:

[[nodiscard]] bool startsWith(QStringView s, Qt::CaseSensitivity cs = Qt::CaseSensitive) const noexcept
    { return QtPrivate::startsWith(*this, s, cs); }